

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::
Data<QHashPrivate::Node<QWidget_*,_std::pair<QEventPoint::State,_QList<QEventPoint>_>_>_>::Data
          (Data<QHashPrivate::Node<QWidget_*,_std::pair<QEventPoint::State,_QList<QEventPoint>_>_>_>
           *this,Data<QHashPrivate::Node<QWidget_*,_std::pair<QEventPoint::State,_QList<QEventPoint>_>_>_>
                 *other,size_t reserved)

{
  Entry *key;
  ulong uVar1;
  Span *pSVar2;
  QWidget *pQVar3;
  Node<QWidget_*,_std::pair<QEventPoint::State,_QList<QEventPoint>_>_> *pNVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  size_t numBuckets;
  R RVar9;
  Bucket BVar10;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  uVar1 = other->size;
  this->size = uVar1;
  if (reserved < uVar1) {
    reserved = uVar1;
  }
  this->seed = other->seed;
  this->spans = (Span *)0x0;
  numBuckets = 0x80;
  if ((0x40 < reserved) && (numBuckets = 0xffffffffffffffff, reserved >> 0x3e == 0)) {
    lVar6 = 0x3f;
    if (reserved != 0) {
      for (; reserved >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    numBuckets = 1L << (0x41 - ((byte)lVar6 ^ 0x3f) & 0x3f);
  }
  this->numBuckets = numBuckets;
  RVar9 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar9.spans;
  uVar1 = other->numBuckets;
  if (0x7f < uVar1) {
    lVar6 = 0;
    uVar7 = 0;
    do {
      pSVar2 = other->spans;
      lVar8 = 0;
      do {
        uVar5 = (ulong)pSVar2->offsets[lVar8 + lVar6];
        if (uVar5 != 0xff) {
          key = pSVar2[uVar7].entries + uVar5;
          pQVar3 = *(QWidget **)(key->storage).data;
          uVar5 = ((ulong)pQVar3 >> 0x20 ^ (ulong)pQVar3) * -0x2917014799a6026d;
          uVar5 = (uVar5 >> 0x20 ^ uVar5) * -0x2917014799a6026d;
          BVar10 = Data<QHashPrivate::Node<QWidget*,std::pair<QEventPoint::State,QList<QEventPoint>>>>
                   ::findBucketWithHash<QWidget*>
                             ((Data<QHashPrivate::Node<QWidget*,std::pair<QEventPoint::State,QList<QEventPoint>>>>
                               *)this,(QWidget **)key,uVar5 >> 0x20 ^ this->seed ^ uVar5);
          pNVar4 = Span<QHashPrivate::Node<QWidget_*,_std::pair<QEventPoint::State,_QList<QEventPoint>_>_>_>
                   ::insert(BVar10.span,BVar10.index);
          pNVar4->key = *(QWidget **)(key->storage).data;
          (pNVar4->value).first = (key->storage).data[8];
          pQVar3 = *(QWidget **)((key->storage).data + 0x10);
          (pNVar4->value).second.d.d = (Data *)pQVar3;
          (pNVar4->value).second.d.ptr = (QEventPoint *)*(QWidget **)((key->storage).data + 0x18);
          (pNVar4->value).second.d.size = (qsizetype)*(QWidget **)((key->storage).data + 0x20);
          if (pQVar3 != (QWidget *)0x0) {
            LOCK();
            *(int *)pQVar3 = *(int *)pQVar3 + 1;
            UNLOCK();
          }
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x80);
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x90;
    } while (uVar7 != uVar1 >> 7);
  }
  return;
}

Assistant:

Data(const Data &other, size_t reserved) : size(other.size), seed(other.seed)
    {
        numBuckets = GrowthPolicy::bucketsForCapacity(qMax(size, reserved));
        spans = allocateSpans(numBuckets).spans;
        size_t otherNSpans = other.numBuckets >> SpanConstants::SpanShift;
        reallocationHelper<true>(other, otherNSpans);
    }